

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties
          (DecimalFormatProperties *this)

{
  (this->compactStyle).fNull = true;
  (this->currency).fNull = true;
  CurrencyUnit::CurrencyUnit(&(this->currency).fValue);
  (this->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr =
       (CurrencyPluralInfo *)0x0;
  (this->currencyUsage).fNull = true;
  (this->negativePrefix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->negativePrefix).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->negativePrefixPattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->negativePrefixPattern).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->negativeSuffix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->negativeSuffix).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->negativeSuffixPattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->negativeSuffixPattern).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->padPosition).fNull = true;
  (this->padString).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->padString).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->parseMode).fNull = true;
  (this->positivePrefix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->positivePrefix).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->positivePrefixPattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->positivePrefixPattern).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->positiveSuffix).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->positiveSuffix).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->positiveSuffixPattern).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00401be0;
  (this->positiveSuffixPattern).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->roundingMode).fNull = true;
  clear(this);
  return;
}

Assistant:

DecimalFormatProperties::DecimalFormatProperties() {
    clear();
}